

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O2

void __thiscall
pstack::Dwarf::DIE::DIE
          (DIE *this,shared_ptr<pstack::Dwarf::Unit> *unit,size_t offset_,
          shared_ptr<pstack::Dwarf::DIE::Raw> *raw)

{
  this->offset = offset_;
  std::__shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>,
             &raw->super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>,
             &unit->super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

DIE(const std::shared_ptr<Unit> &unit, size_t offset_, const std::shared_ptr<Raw> &raw)
        : offset(offset_)
        , raw(raw)
        , unit(unit)
        {}